

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O2

FaceData * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
get(PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*> *this,
   ReductionKey *key)

{
  uint32_t uVar1;
  Entry *pEVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = this->_numEntries;
  pEVar2 = getEntries(this);
  uVar4 = key->_val & 0xffffffff;
  do {
    uVar3 = (uint)uVar4 & uVar1 - 1;
    if (pEVar2[uVar3].key._val == key->_val) {
      return pEVar2[uVar3].value;
    }
    uVar4 = (ulong)((uint)uVar4 + 1);
  } while (pEVar2[uVar3].value != (FaceData *)0x0);
  return (FaceData *)0x0;
}

Assistant:

Value get(Key& key)
    {
        uint32_t mask = _numEntries-1;
        Entry* entries = getEntries();
        uint32_t hash = key.hash();

        Value result = 0;
        for (uint32_t i = hash;; ++i) {
            Entry& e = entries[i & mask];
            if (e.key.matches(key)) {
                result = e.value;
                break;
            }
            if (e.value == 0) {
                break;
            }
        }

        return result;
    }